

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::on_disk_read_complete
          (peer_connection *this,disk_buffer_holder *buffer,storage_error *error,peer_request *r,
          time_point issue_time)

{
  _Atomic_word *p_Var1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  error_category *peVar6;
  session_settings *psVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  undefined4 extraout_var;
  alert_manager *paVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  bool bVar12;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  disk_buffer_holder *local_80;
  ulong local_78;
  peer_request *local_70;
  undefined1 local_68 [56];
  
  local_80 = buffer;
  lVar10 = ::std::chrono::_V2::system_clock::now();
  lVar10 = (lVar10 - (long)issue_time.__d.__r) / 1000;
  iVar9 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar9) + 0x68) < 0) {
    uVar3 = (r->piece).m_val;
    uVar4 = r->start;
    local_78 = (ulong)(uint)r->length;
    pcVar5 = local_80->m_buf;
    peVar6 = (error->ec).cat_;
    local_70 = r;
    (*peVar6->_vptr_error_category[4])(local_a0,peVar6,(ulong)(uint)(error->ec).val_);
    peer_log(this,info,"FILE_ASYNC_READ_COMPLETE","piece: %d s: %x l: %x b: %p e: %s rtt: %d us",
             (ulong)uVar3,(ulong)uVar4,local_78,pcVar5,local_a0._0_8_,lVar10);
    r = local_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ != &local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
      r = local_70;
    }
  }
  this->m_reading_bytes = this->m_reading_bytes - r->length;
  this_00 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar9 = this_00->_M_use_count;
    do {
      if (iVar9 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = this_00->_M_use_count;
      bVar12 = iVar9 == iVar2;
      if (bVar12) {
        this_00->_M_use_count = iVar9 + 1;
        iVar2 = iVar9;
      }
      iVar9 = iVar2;
      UNLOCK();
    } while (!bVar12);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar12 = true;
  }
  else {
    bVar12 = this_00->_M_use_count == 0;
  }
  if (bVar12) {
    this_01 = (torrent *)0x0;
  }
  else {
    this_01 = (this->super_peer_connection_hot_members).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if ((error->ec).val_ == 0) {
    this->m_disk_read_failures = '\0';
    if (this_01 != (torrent *)0x0) {
      psVar7 = (this->super_peer_connection_hot_members).m_settings;
      local_a0._0_8_ = &psVar7->m_mutex;
      local_a0[8] = false;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_a0);
      local_a0[8] = true;
      iVar9 = (psVar7->m_store).m_ints._M_elems[0x19];
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_a0);
      if (iVar9 == 1) {
        torrent::add_suggest_piece(this_01,(piece_index_t)(r->piece).m_val);
      }
    }
    if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_0024fe16;
    if (this_01 != (torrent *)0x0) {
      peer_log(this,outgoing_message,"PIECE","piece: %d s: %x l: %x",(ulong)(uint)(r->piece).m_val,
               (ulong)(uint)r->start,(ulong)(uint)r->length);
      counters::blend_stats_counter(this->m_counters,0xf2,(long)(int)lVar10,5);
      psVar7 = (this->super_peer_connection_hot_members).m_settings;
      local_a0._0_8_ = &psVar7->m_mutex;
      local_a0[8] = false;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_a0);
      local_a0[8] = true;
      iVar9 = (psVar7->m_store).m_ints._M_elems[0x19];
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_a0);
      if (iVar9 == 1) {
        torrent::add_suggest_piece(this_01,(piece_index_t)(r->piece).m_val);
      }
      disk_buffer_holder::disk_buffer_holder((disk_buffer_holder *)(local_68 + 0x10),local_80);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x28])
                (this,r,(disk_buffer_holder *)(local_68 + 0x10));
      disk_buffer_holder::~disk_buffer_holder((disk_buffer_holder *)(local_68 + 0x10));
      goto LAB_0024fe16;
    }
  }
  else if (this_01 != (torrent *)0x0) {
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x26])
              (this,(ulong)(uint)(r->piece).m_val);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x2b])(this,r);
    paVar11 = torrent::alerts(this_01);
    if (((paVar11->m_alert_mask)._M_i.m_val & 0x49) != 0) {
      paVar11 = torrent::alerts(this_01);
      torrent::resolve_filename_abi_cxx11_
                ((string *)local_a0,this_01,(file_index_t)(int)*(int3 *)&error->field_0x10);
      torrent::get_handle((torrent *)local_68);
      alert_manager::
      emplace_alert<libtorrent::file_error_alert,boost::system::error_code_const&,std::__cxx11::string,libtorrent::operation_t_const&,libtorrent::torrent_handle>
                (paVar11,&error->ec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &error->operation,(torrent_handle *)local_68);
      if ((piece_picker *)local_68._8_8_ != (piece_picker *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)(local_68._8_8_ + 0xc);
          iVar9 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar9 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
          *(int *)(local_68._8_8_ + 0xc) = iVar9 + -1;
        }
        if (iVar9 == 1) {
          (*(code *)(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ).
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start[3])();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ != &local_90) {
        operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
      }
    }
    bVar8 = this->m_disk_read_failures + 1;
    this->m_disk_read_failures = bVar8;
    if (bVar8 < 0x65) goto LAB_0024fe16;
  }
  (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,error,8,0);
LAB_0024fe16:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void peer_connection::on_disk_read_complete(disk_buffer_holder buffer
		, storage_error const& error
		, peer_request const& r, time_point const issue_time)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(r.length >= 0);

		// return value:
		// 0: success, piece passed hash check
		// -1: disk failure

		int const disk_rtt = int(total_microseconds(clock_type::now() - issue_time));

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "FILE_ASYNC_READ_COMPLETE"
				, "piece: %d s: %x l: %x b: %p e: %s rtt: %d us"
				, static_cast<int>(r.piece), r.start, r.length
				, static_cast<void*>(buffer.data())
				, error.ec.message().c_str(), disk_rtt);
		}
#endif

		m_reading_bytes -= r.length;

		auto t = m_torrent.lock();
		if (error)
		{
			if (!t)
			{
				disconnect(error.ec, operation_t::file_read);
				return;
			}

			write_dont_have(r.piece);
			write_reject_request(r);
			if (t->alerts().should_post<file_error_alert>())
				t->alerts().emplace_alert<file_error_alert>(error.ec
					, t->resolve_filename(error.file())
					, error.operation, t->get_handle());

			++m_disk_read_failures;
			if (m_disk_read_failures > 100) disconnect(error.ec, operation_t::file_read);
			return;
		}

		// we're only interested in failures in a row.
		// if we every now and then successfully send a
		// block, the peer is still useful
		m_disk_read_failures = 0;

		if (t && m_settings.get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache)
		{
			// tell the torrent that we just read a block from this piece.
			// if this piece is low-availability, it's now a candidate for being
			// suggested to other peers
			t->add_suggest_piece(r.piece);
		}

		if (m_disconnecting) return;

		if (!t)
		{
			disconnect(error.ec, operation_t::file_read);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message
			, "PIECE", "piece: %d s: %x l: %x"
			, static_cast<int>(r.piece), r.start, r.length);
#endif

		m_counters.blend_stats_counter(counters::request_latency, disk_rtt, 5);

		// we probably just pulled this piece into the cache.
		// if it's rare enough to make it into the suggested piece
		// push another piece out
		if (m_settings.get_int(settings_pack::suggest_mode) == settings_pack::suggest_read_cache)
		{
			t->add_suggest_piece(r.piece);
		}
		write_piece(r, std::move(buffer));
	}